

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O2

float set_side_length(mixed_channel_t set,vbap_data *data)

{
  byte bVar1;
  ulong uVar2;
  float (*b) [3];
  undefined7 in_register_00000039;
  float (*a) [3];
  float (*b_00) [3];
  float fVar3;
  float fVar4;
  float fVar5;
  float cross [3];
  float local_24;
  float local_20;
  float local_1c;
  
  uVar2 = CONCAT71(in_register_00000039,set) & 0xffffffff;
  a = data->speakers + data->sets[uVar2].speakers[0];
  b_00 = data->speakers + data->sets[uVar2].speakers[1];
  bVar1 = data->sets[uVar2].speakers[2];
  b = data->speakers + bVar1;
  fVar3 = vec_angle(*a,*b_00);
  fVar4 = vec_angle(*a,*b);
  fVar5 = vec_angle(*b_00,*b);
  fVar3 = ABS(fVar5) + ABS(fVar4) + ABS(fVar3);
  vec_cross(&local_24,*a,*b_00);
  fVar4 = 0.0;
  if (1e-06 < fVar3) {
    fVar4 = ABS(local_1c * data->speakers[bVar1][2] +
                local_24 * (*b)[0] + local_20 * data->speakers[bVar1][1]) / fVar3;
  }
  return fVar4;
}

Assistant:

float set_side_length(mixed_channel_t set, struct vbap_data *data){
  float cross[3];
  float *i = data->speakers[data->sets[set].speakers[0]];
  float *j = data->speakers[data->sets[set].speakers[1]];
  float *k = data->speakers[data->sets[set].speakers[2]];
  float length = fabsf(vec_angle(i, j))
                 + fabsf(vec_angle(i, k))
                 + fabsf(vec_angle(j, k));
  vec_cross(cross, i, j);
  if(0.000001 < length) return fabsf(vec_dot(cross, k)) / length;
  return 0.0;
}